

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Parameters PVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  char *__s;
  undefined8 uStack_1d8;
  float local_1d0;
  undefined4 uStack_1cc;
  undefined1 local_1c8 [32];
  string local_1a8 [32];
  State state;
  string httpRoot;
  Parameters parameters;
  Parameters local_b0;
  
  printf("Usage: %s [port] [httpRoot] [nBalls]\n",*argv);
  if (argc < 2) {
    __s = "../examples";
    iVar2 = 3000;
  }
  else {
    iVar2 = atoi(argv[1]);
    if (argc == 2) {
      __s = "../examples";
    }
    else {
      __s = argv[2];
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&httpRoot,__s,(allocator<char> *)&parameters);
  if (argc < 4) {
    uVar5 = 0x40;
  }
  else {
    uVar3 = atoi(argv[3]);
    uVar5 = 0x80;
    if (((int)uVar3 < 0x80) && (uVar5 = 1, 1 < (int)uVar3)) {
      uVar5 = uVar3;
    }
  }
  State::State(&state);
  State::init(&state,(EVP_PKEY_CTX *)(ulong)uVar5);
  Incppect<false>::Parameters::Parameters(&parameters);
  parameters.maxPayloadLength_bytes = 0x40000;
  parameters.portListen = iVar2;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                 &httpRoot,"/balls3d");
  std::__cxx11::string::operator=((string *)&parameters.httpRoot,(string *)local_1c8);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"",(allocator<char> *)((long)&uStack_1cc + 3));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a8,"index.html",(allocator<char> *)((long)&uStack_1cc + 2));
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &parameters.resources,local_1c8,&state);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_1c8 + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  Incppect<false>::getInstance();
  Incppect<false>::Parameters::Parameters(&local_b0,&parameters);
  PVar1.tLastRequestTimeout_ms._0_4_ = local_1d0;
  PVar1._0_8_ = uStack_1d8;
  PVar1.tLastRequestTimeout_ms._4_4_ = uStack_1cc;
  PVar1._16_8_ = local_1c8._0_8_;
  PVar1.httpRoot._M_dataplus._M_p = (pointer)local_1c8._8_8_;
  PVar1.httpRoot._M_string_length = local_1c8._16_8_;
  PVar1.httpRoot.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )stack0xfffffffffffffe50;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )local_1a8._8_24_;
  PVar1.sslKey._M_dataplus._M_p._0_4_ = state.t;
  PVar1._84_60_ = stack0xfffffffffffffe7c;
  Incppect<false>::runAsync(PVar1);
  std::thread::detach();
  std::thread::~thread((thread *)local_1c8);
  Incppect<false>::Parameters::~Parameters(&local_b0);
  local_1d0 = 0.0;
  do {
    if (local_1d0 < state.t) {
      printf(" - Simulating 3D elastic collisions at t = %4.2f ...\n",(double)state.t);
      local_1d0 = local_1d0 + 1.0;
    }
    State::update(&state);
    local_1c8._0_8_ = (pointer)0x1;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)local_1c8);
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
	printf("Usage: %s [port] [httpRoot] [nBalls]\n", argv[0]);

    int port = argc > 1 ? atoi(argv[1]) : 3000;
    std::string httpRoot = argc > 2 ? argv[2] : "../examples";
    int nBalls = argc > 3 ? atoi(argv[3]) : 64;

    nBalls = std::max(1, std::min(128, nBalls));

    State state;
    state.init(nBalls);

    incppect::Parameters parameters;
    parameters.portListen = port;
    parameters.maxPayloadLength_bytes = 256*1024;
    parameters.httpRoot = httpRoot + "/balls3d";
    parameters.resources = { "", "index.html", };

    incppect::getInstance().runAsync(parameters).detach();

    float checkpoint = 0.0f;
    while (true) {
        if (state.t > checkpoint) {
            printf(" - Simulating 3D elastic collisions at t = %4.2f ...\n", state.t);
            checkpoint += 1.0f;
        }

        state.update();

        std::this_thread::sleep_for(std::chrono::milliseconds(1));
    }

    return 0;
}